

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O0

void enlarge_ntuple_list(ntuple_list n_tuple)

{
  double *pdVar1;
  ntuple_list n_tuple_local;
  
  if (((n_tuple == (ntuple_list)0x0) || (n_tuple->values == (double *)0x0)) ||
     (n_tuple->max_size == 0)) {
    error("enlarge_ntuple_list: invalid n-tuple.");
  }
  n_tuple->max_size = n_tuple->max_size << 1;
  pdVar1 = (double *)realloc(n_tuple->values,(ulong)(n_tuple->dim * n_tuple->max_size) << 3);
  n_tuple->values = pdVar1;
  if (n_tuple->values == (double *)0x0) {
    error("not enough memory.");
  }
  return;
}

Assistant:

void enlarge_ntuple_list(ntuple_list n_tuple)
{
    /* check parameters */
    if ( n_tuple == NULL || n_tuple->values == NULL || n_tuple->max_size == 0 )
        error("enlarge_ntuple_list: invalid n-tuple.");

    /* duplicate number of tuples */
    n_tuple->max_size *= 2;

    /* realloc memory */
    n_tuple->values = (double *) realloc( (void *) n_tuple->values,
                                          n_tuple->dim * n_tuple->max_size * sizeof(double) );
    if ( n_tuple->values == NULL ) error("not enough memory.");
}